

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool Dijkstra(DAG *_Dag)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  iterator next;
  iterator loc;
  int j;
  int local_5c;
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  _minHeap;
  
  _minHeap.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _minHeap.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _minHeap.c.
  super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next._M_current =
       (_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
       super__Vector_impl_data._M_start;
  loc._M_current = next._M_current;
  std::
  priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ::push(&_minHeap,&loc);
  (loc._M_current)->visited = true;
  do {
    loc._M_current =
         (_minHeap.c.
          super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_current;
    std::
    priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
    ::pop(&_minHeap);
    if (loc._M_current <
        (_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var4 = ((loc._M_current)->nextPos).
               super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)&(loc._M_current)->nextPos) {
        next._M_current = loc._M_current + 1;
        if (loc._M_current[1].visited == false) {
          std::
          priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
          ::push(&_minHeap,&next);
          (next._M_current)->visited = true;
        }
      }
      else {
        uVar1 = (loc._M_current)->Weight;
        for (; p_Var4 != (_List_node_base *)&(loc._M_current)->nextPos; p_Var4 = p_Var4->_M_next) {
          j = (int)*(byte *)&p_Var4[1]._M_next;
          local_5c = (int)(((long)loc._M_current -
                           (long)(_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                                 _M_impl.super__Vector_impl_data._M_start) / 0x28);
          uVar2 = getPathWeight(&local_5c,&j);
          uVar3 = uVar2 + uVar1;
          next._M_current = loc._M_current + j;
          if (uVar3 < loc._M_current[j].Weight) {
            (next._M_current)->Weight = uVar3;
            (next._M_current)->prev =
                 (int)(((long)loc._M_current -
                       (long)(_Dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl
                             .super__Vector_impl_data._M_start) / 0x28);
          }
          if ((next._M_current)->visited == false) {
            std::
            priority_queue<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::vector<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
            ::push(&_minHeap,&next);
            (next._M_current)->visited = true;
          }
        }
      }
    }
  } while (_minHeap.c.
           super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           _minHeap.c.
           super__Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
  ::~_Vector_base((_Vector_base<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<DAG_node_*,_std::vector<DAG_node,_std::allocator<DAG_node>_>_>_>_>
                   *)&_minHeap);
  return true;
}

Assistant:

bool Dijkstra(DAG &_Dag)
{
    priority_queue<vector<DAG_node>::iterator> _minHeap;
    auto loc = _Dag.begin();
    auto next = loc;
    int j;
    uint32_t curW, nextW;
    list<uint8_t>::iterator iter;
    _minHeap.push(loc);
    loc->visited = true;
    do {
        loc = _minHeap.top();
        _minHeap.pop();
        if (loc >= _Dag.end()) continue;
        if (loc->nextPos.empty()) {
           next = loc + 1;
           if (! next->visited) {
             _minHeap.push(next);
             next->visited = true;
           }
           continue;
        }
        curW = loc->Weight;
        for (iter = loc->nextPos.begin(); iter != loc->nextPos.end(); iter++) {
             j = *iter;
             nextW = curW + getPathWeight(int(loc-_Dag.begin()), j);
             next = loc + j;
             if (nextW < next->Weight) {
                 next->Weight = nextW;
                 next->prev = int(loc - _Dag.begin());
             }
             if ( ! next->visited ) {
                _minHeap.push(next);
                next->visited = true;
             }
        }

    } while ( ! _minHeap.empty() );
    return true;
}